

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::OutputData(Node *this,ostream *os)

{
  ostream *poVar1;
  Node *pNVar2;
  string local_50;
  
  DataWidth = 0;
  Indent_abi_cxx11_(&local_50,this);
  std::operator<<(os,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (this->Tree[0] == (Node *)0x0) {
    std::operator<<(os,"\"\"");
  }
  else {
    OutputDataValue(this->Tree[0],os);
  }
  pNVar2 = this;
  while (pNVar2 = pNVar2->Tree[1], pNVar2 != (Node *)0x0) {
    poVar1 = std::operator<<(os,",");
    std::endl<char,std::char_traits<char>>(poVar1);
    DataWidth = 0;
    Indent_abi_cxx11_(&local_50,this);
    std::operator<<(os,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pNVar2->Tree[0] == (Node *)0x0) {
      std::operator<<(os,"\"\"");
    }
    else {
      OutputDataValue(pNVar2->Tree[0],os);
    }
  }
  return;
}

Assistant:

void Node::OutputData(
	std::ostream& os	/**< Output stream */
)
{
	DataWidth = 0;
	os << Indent();

	//
	// Handle NULL values specially
	//
	if (Tree[0] == 0)
	{
		os << "\"\"";
	}
	else
	{
		Tree[0]->OutputDataValue(os);
	}

	//
	// Handle additional data statements attached to this one
	//
	Node* Loop = Tree[1];
	while (Loop != 0)
	{
		//
		// Let's start on a new line for each new
		// data statement, so we keep more of the
		// original formatting.
		//
		os << "," << std::endl;
		DataWidth = 0;
		os << Indent();

		//
		// Handle NULL values specially
		//
		if (Loop->Tree[0] == 0)
		{
			os << "\"\"";
		}
		else
		{
			Loop->Tree[0]->OutputDataValue(os);
		}
		Loop = Loop->Tree[1];
	}
}